

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alignment_panel.cxx
# Opt level: O0

void show_global_settings_window(void)

{
  if (global_settings_window == (Fl_Double_Window *)0x0) {
    make_global_settings_window();
  }
  readPrefs();
  refreshUI();
  fl_message(
            "WARNING!\n\nThe following dialog changes the user interface behavior\nof ALL FLTK applications, for the current user, or for \nALL users on this machine.\n\nPlease choose these settings carefully, or reset\nuser and system settings to \"default\"."
            );
  (*(global_settings_window->super_Fl_Window).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[5])();
  return;
}

Assistant:

void show_global_settings_window() {
  if (!global_settings_window)
    make_global_settings_window();
  readPrefs();
  refreshUI();
  fl_message(
  	"WARNING!\n\n"
  	"The following dialog changes the user interface behavior\n"
  	"of ALL FLTK applications, for the current user, or for \n"
  	"ALL users on this machine.\n\n"
  	"Please choose these settings carefully, or reset\n"
  	"user and system settings to \"default\".");
  global_settings_window->show();
}